

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_button_behavior(nk_flags *state,nk_rect r,nk_input *i,nk_button_behavior behavior)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = *state & 2 | 4;
  *state = uVar4;
  if (i == (nk_input *)0x0) {
    uVar3 = 0;
  }
  else {
    iVar2 = nk_input_is_mouse_hovering_rect(i,r);
    if (iVar2 == 0) {
      uVar3 = 0;
    }
    else {
      *state = 0x12;
      uVar4 = (uint)((i->mouse).buttons[0].down != 0) * 0x10 + 0x12;
      *state = uVar4;
      iVar2 = nk_input_has_mouse_click_in_rect(i,NK_BUTTON_LEFT,r);
      uVar3 = 0;
      if (((iVar2 != 0) && (uVar3 = (i->mouse).buttons[0].down, behavior == NK_BUTTON_DEFAULT)) &&
         (bVar5 = uVar3 == 0, uVar3 = 0, bVar5)) {
        uVar3 = (uint)((i->mouse).buttons[0].clicked != 0);
      }
    }
    if (((uVar4 & 0x10) == 0) || (iVar2 = nk_input_is_mouse_prev_hovering_rect(i,r), iVar2 != 0)) {
      iVar2 = nk_input_is_mouse_prev_hovering_rect(i,r);
      if (iVar2 == 0) {
        return uVar3;
      }
      uVar1 = 0x40;
    }
    else {
      uVar1 = 8;
    }
    *state = uVar4 | uVar1;
  }
  return uVar3;
}

Assistant:

NK_LIB int
nk_button_behavior(nk_flags *state, struct nk_rect r,
    const struct nk_input *i, enum nk_button_behavior behavior)
{
    int ret = 0;
    nk_widget_state_reset(state);
    if (!i) return 0;
    if (nk_input_is_mouse_hovering_rect(i, r)) {
        *state = NK_WIDGET_STATE_HOVERED;
        if (nk_input_is_mouse_down(i, NK_BUTTON_LEFT))
            *state = NK_WIDGET_STATE_ACTIVE;
        if (nk_input_has_mouse_click_in_rect(i, NK_BUTTON_LEFT, r)) {
            ret = (behavior != NK_BUTTON_DEFAULT) ?
                nk_input_is_mouse_down(i, NK_BUTTON_LEFT):
#ifdef NK_BUTTON_TRIGGER_ON_RELEASE
                nk_input_is_mouse_released(i, NK_BUTTON_LEFT);
#else
                nk_input_is_mouse_pressed(i, NK_BUTTON_LEFT);
#endif
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_LEFT;
    return ret;
}